

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O2

string * __thiscall
TransitionObservationIndependentMADPDiscrete::SoftPrintJointActionSet_abi_cxx11_
          (string *__return_storage_ptr__,TransitionObservationIndependentMADPDiscrete *this)

{
  pointer ppJVar1;
  ostream *poVar2;
  E *this_00;
  pointer ppJVar3;
  stringstream ss;
  ostream local_328 [376];
  stringstream str;
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&str);
  if (this->_m_initialized != false) {
    ppJVar1 = (this->_m_jointActionVec).
              super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppJVar3 = (this->_m_jointActionVec).
                   super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppJVar3 != ppJVar1;
        ppJVar3 = ppJVar3 + 1) {
      (*((*ppJVar3)->super_JointAction)._vptr_JointAction[3])(&ss);
      std::operator<<(local_1a0,(string *)&ss);
      std::__cxx11::string::~string((string *)&ss);
      std::endl<char,std::char_traits<char>>(local_1a0);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&str);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_328,"TransitionObservationIndependentMADPDiscrete::PrintJoint");
  poVar2 = std::operator<<(poVar2,"ActionSets() - Error: not initialized. ");
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,&ss);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

string TransitionObservationIndependentMADPDiscrete::SoftPrintJointActionSet() 
    const
{
    stringstream str;
    if(!_m_initialized)
    {
        stringstream ss;
            ss << "TransitionObservationIndependentMADPDiscrete::PrintJoint"<<
                "ActionSets() - Error: not initialized. "<<endl;
        throw E(ss);
    }   
    vector<JointActionDiscrete*>::const_iterator ja_it = 
        _m_jointActionVec.begin();
    vector<JointActionDiscrete*>::const_iterator ja_last = 
        _m_jointActionVec.end();
    while(ja_it != ja_last)
    {
        str << (*ja_it)->SoftPrint();
        str<<endl;
        ja_it++;    
    }
    return(str.str());
}